

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O2

int64 __thiscall TTD::EventLog::GetFirstEventTimeInLog(EventLog *this)

{
  bool bVar1;
  EventLogEntry *pEVar2;
  int64 iVar3;
  undefined1 local_38 [8];
  Iterator iter;
  
  TTEventList::GetIteratorAtFirst((Iterator *)local_38,&this->m_eventList);
  while( true ) {
    if (local_38 == (undefined1  [8])0x0) {
      return -1;
    }
    if (iter.m_currLink < *(TTEventListLink **)((long)local_38 + 8)) {
      return -1;
    }
    if ((TTEventListLink *)*(size_t *)local_38 <= iter.m_currLink) {
      return -1;
    }
    pEVar2 = TTEventList::Iterator::Current((Iterator *)local_38);
    bVar1 = NSLogEvents::IsJsRTActionRootCall(pEVar2);
    if (bVar1) break;
    TTEventList::Iterator::MoveNext((Iterator *)local_38);
  }
  pEVar2 = TTEventList::Iterator::Current((Iterator *)local_38);
  iVar3 = NSLogEvents::GetTimeFromRootCallOrSnapshot(pEVar2);
  return iVar3;
}

Assistant:

int64 EventLog::GetFirstEventTimeInLog() const
    {
        for(auto iter = this->m_eventList.GetIteratorAtFirst(); iter.IsValid(); iter.MoveNext())
        {
            if(NSLogEvents::IsJsRTActionRootCall(iter.Current()))
            {
                return NSLogEvents::GetTimeFromRootCallOrSnapshot(iter.Current());
            }
        }

        return -1;
    }